

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_error.cpp
# Opt level: O2

string * ScriptErrorString_abi_cxx11_(string *__return_storage_ptr__,ScriptError serror)

{
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(serror) {
  case SCRIPT_ERR_OK:
    __s = "No error";
    break;
  default:
    __s = "unknown error";
    break;
  case SCRIPT_ERR_EVAL_FALSE:
    __s = "Script evaluated without error but finished with a false/empty top stack element";
    break;
  case SCRIPT_ERR_OP_RETURN:
    __s = "OP_RETURN was encountered";
    break;
  case SCRIPT_ERR_SCRIPT_SIZE:
    __s = "Script is too big";
    break;
  case SCRIPT_ERR_PUSH_SIZE:
    __s = "Push value size limit exceeded";
    break;
  case SCRIPT_ERR_OP_COUNT:
    __s = "Operation limit exceeded";
    break;
  case SCRIPT_ERR_STACK_SIZE:
    __s = "Stack size limit exceeded";
    break;
  case SCRIPT_ERR_SIG_COUNT:
    __s = "Signature count negative or greater than pubkey count";
    break;
  case SCRIPT_ERR_PUBKEY_COUNT:
    __s = "Pubkey count negative or limit exceeded";
    break;
  case SCRIPT_ERR_VERIFY:
    __s = "Script failed an OP_VERIFY operation";
    break;
  case SCRIPT_ERR_EQUALVERIFY:
    __s = "Script failed an OP_EQUALVERIFY operation";
    break;
  case SCRIPT_ERR_CHECKMULTISIGVERIFY:
    __s = "Script failed an OP_CHECKMULTISIGVERIFY operation";
    break;
  case SCRIPT_ERR_CHECKSIGVERIFY:
    __s = "Script failed an OP_CHECKSIGVERIFY operation";
    break;
  case SCRIPT_ERR_NUMEQUALVERIFY:
    __s = "Script failed an OP_NUMEQUALVERIFY operation";
    break;
  case SCRIPT_ERR_BAD_OPCODE:
    __s = "Opcode missing or not understood";
    break;
  case SCRIPT_ERR_DISABLED_OPCODE:
    __s = "Attempted to use a disabled opcode";
    break;
  case SCRIPT_ERR_INVALID_STACK_OPERATION:
    __s = "Operation not valid with the current stack size";
    break;
  case SCRIPT_ERR_INVALID_ALTSTACK_OPERATION:
    __s = "Operation not valid with the current altstack size";
    break;
  case SCRIPT_ERR_UNBALANCED_CONDITIONAL:
    __s = "Invalid OP_IF construction";
    break;
  case SCRIPT_ERR_NEGATIVE_LOCKTIME:
    __s = "Negative locktime";
    break;
  case SCRIPT_ERR_UNSATISFIED_LOCKTIME:
    __s = "Locktime requirement not satisfied";
    break;
  case SCRIPT_ERR_SIG_HASHTYPE:
    __s = "Signature hash type missing or not understood";
    break;
  case SCRIPT_ERR_SIG_DER:
    __s = "Non-canonical DER signature";
    break;
  case SCRIPT_ERR_MINIMALDATA:
    __s = "Data push larger than necessary";
    break;
  case SCRIPT_ERR_SIG_PUSHONLY:
    __s = "Only push operators allowed in signatures";
    break;
  case SCRIPT_ERR_SIG_HIGH_S:
    __s = "Non-canonical signature: S value is unnecessarily high";
    break;
  case SCRIPT_ERR_SIG_NULLDUMMY:
    __s = "Dummy CHECKMULTISIG argument must be zero";
    break;
  case SCRIPT_ERR_PUBKEYTYPE:
    __s = "Public key is neither compressed or uncompressed";
    break;
  case SCRIPT_ERR_CLEANSTACK:
    __s = "Stack size must be exactly one after execution";
    break;
  case SCRIPT_ERR_MINIMALIF:
    __s = "OP_IF/NOTIF argument must be minimal";
    break;
  case SCRIPT_ERR_SIG_NULLFAIL:
    __s = "Signature must be zero for failed CHECK(MULTI)SIG operation";
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_NOPS:
    __s = "NOPx reserved for soft-fork upgrades";
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM:
    __s = "Witness version reserved for soft-fork upgrades";
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION:
    __s = "Taproot version reserved for soft-fork upgrades";
    break;
  case SCRIPT_ERR_DISCOURAGE_OP_SUCCESS:
    __s = "OP_SUCCESSx reserved for soft-fork upgrades";
    break;
  case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE:
    __s = "Public key version reserved for soft-fork upgrades";
    break;
  case SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH:
    __s = "Witness program has incorrect length";
    break;
  case SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY:
    __s = "Witness program was passed an empty witness";
    break;
  case SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH:
    __s = "Witness program hash mismatch";
    break;
  case SCRIPT_ERR_WITNESS_MALLEATED:
    __s = "Witness requires empty scriptSig";
    break;
  case SCRIPT_ERR_WITNESS_MALLEATED_P2SH:
    __s = "Witness requires only-redeemscript scriptSig";
    break;
  case SCRIPT_ERR_WITNESS_UNEXPECTED:
    __s = "Witness provided for non-witness script";
    break;
  case SCRIPT_ERR_WITNESS_PUBKEYTYPE:
    __s = "Using non-compressed keys in segwit";
    break;
  case SCRIPT_ERR_SCHNORR_SIG_SIZE:
    __s = "Invalid Schnorr signature size";
    break;
  case SCRIPT_ERR_SCHNORR_SIG_HASHTYPE:
    __s = "Invalid Schnorr signature hash type";
    break;
  case SCRIPT_ERR_SCHNORR_SIG:
    __s = "Invalid Schnorr signature";
    break;
  case SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE:
    __s = "Invalid Taproot control block size";
    break;
  case SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT:
    __s = "Too much signature validation relative to witness weight";
    break;
  case SCRIPT_ERR_TAPSCRIPT_CHECKMULTISIG:
    __s = "OP_CHECKMULTISIG(VERIFY) is not available in tapscript";
    break;
  case SCRIPT_ERR_TAPSCRIPT_MINIMALIF:
    __s = "OP_IF/NOTIF argument must be minimal in tapscript";
    break;
  case SCRIPT_ERR_OP_CODESEPARATOR:
    __s = "Using OP_CODESEPARATOR in non-witness script";
    break;
  case SCRIPT_ERR_SIG_FINDANDDELETE:
    __s = "Signature is found in scriptCode";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ScriptErrorString(const ScriptError serror)
{
    switch (serror)
    {
        case SCRIPT_ERR_OK:
            return "No error";
        case SCRIPT_ERR_EVAL_FALSE:
            return "Script evaluated without error but finished with a false/empty top stack element";
        case SCRIPT_ERR_VERIFY:
            return "Script failed an OP_VERIFY operation";
        case SCRIPT_ERR_EQUALVERIFY:
            return "Script failed an OP_EQUALVERIFY operation";
        case SCRIPT_ERR_CHECKMULTISIGVERIFY:
            return "Script failed an OP_CHECKMULTISIGVERIFY operation";
        case SCRIPT_ERR_CHECKSIGVERIFY:
            return "Script failed an OP_CHECKSIGVERIFY operation";
        case SCRIPT_ERR_NUMEQUALVERIFY:
            return "Script failed an OP_NUMEQUALVERIFY operation";
        case SCRIPT_ERR_SCRIPT_SIZE:
            return "Script is too big";
        case SCRIPT_ERR_PUSH_SIZE:
            return "Push value size limit exceeded";
        case SCRIPT_ERR_OP_COUNT:
            return "Operation limit exceeded";
        case SCRIPT_ERR_STACK_SIZE:
            return "Stack size limit exceeded";
        case SCRIPT_ERR_SIG_COUNT:
            return "Signature count negative or greater than pubkey count";
        case SCRIPT_ERR_PUBKEY_COUNT:
            return "Pubkey count negative or limit exceeded";
        case SCRIPT_ERR_BAD_OPCODE:
            return "Opcode missing or not understood";
        case SCRIPT_ERR_DISABLED_OPCODE:
            return "Attempted to use a disabled opcode";
        case SCRIPT_ERR_INVALID_STACK_OPERATION:
            return "Operation not valid with the current stack size";
        case SCRIPT_ERR_INVALID_ALTSTACK_OPERATION:
            return "Operation not valid with the current altstack size";
        case SCRIPT_ERR_OP_RETURN:
            return "OP_RETURN was encountered";
        case SCRIPT_ERR_UNBALANCED_CONDITIONAL:
            return "Invalid OP_IF construction";
        case SCRIPT_ERR_NEGATIVE_LOCKTIME:
            return "Negative locktime";
        case SCRIPT_ERR_UNSATISFIED_LOCKTIME:
            return "Locktime requirement not satisfied";
        case SCRIPT_ERR_SIG_HASHTYPE:
            return "Signature hash type missing or not understood";
        case SCRIPT_ERR_SIG_DER:
            return "Non-canonical DER signature";
        case SCRIPT_ERR_MINIMALDATA:
            return "Data push larger than necessary";
        case SCRIPT_ERR_SIG_PUSHONLY:
            return "Only push operators allowed in signatures";
        case SCRIPT_ERR_SIG_HIGH_S:
            return "Non-canonical signature: S value is unnecessarily high";
        case SCRIPT_ERR_SIG_NULLDUMMY:
            return "Dummy CHECKMULTISIG argument must be zero";
        case SCRIPT_ERR_MINIMALIF:
            return "OP_IF/NOTIF argument must be minimal";
        case SCRIPT_ERR_SIG_NULLFAIL:
            return "Signature must be zero for failed CHECK(MULTI)SIG operation";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_NOPS:
            return "NOPx reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM:
            return "Witness version reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION:
            return "Taproot version reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_OP_SUCCESS:
            return "OP_SUCCESSx reserved for soft-fork upgrades";
        case SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE:
            return "Public key version reserved for soft-fork upgrades";
        case SCRIPT_ERR_PUBKEYTYPE:
            return "Public key is neither compressed or uncompressed";
        case SCRIPT_ERR_CLEANSTACK:
            return "Stack size must be exactly one after execution";
        case SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH:
            return "Witness program has incorrect length";
        case SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY:
            return "Witness program was passed an empty witness";
        case SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH:
            return "Witness program hash mismatch";
        case SCRIPT_ERR_WITNESS_MALLEATED:
            return "Witness requires empty scriptSig";
        case SCRIPT_ERR_WITNESS_MALLEATED_P2SH:
            return "Witness requires only-redeemscript scriptSig";
        case SCRIPT_ERR_WITNESS_UNEXPECTED:
            return "Witness provided for non-witness script";
        case SCRIPT_ERR_WITNESS_PUBKEYTYPE:
            return "Using non-compressed keys in segwit";
        case SCRIPT_ERR_SCHNORR_SIG_SIZE:
            return "Invalid Schnorr signature size";
        case SCRIPT_ERR_SCHNORR_SIG_HASHTYPE:
            return "Invalid Schnorr signature hash type";
        case SCRIPT_ERR_SCHNORR_SIG:
            return "Invalid Schnorr signature";
        case SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE:
            return "Invalid Taproot control block size";
        case SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT:
            return "Too much signature validation relative to witness weight";
        case SCRIPT_ERR_TAPSCRIPT_CHECKMULTISIG:
            return "OP_CHECKMULTISIG(VERIFY) is not available in tapscript";
        case SCRIPT_ERR_TAPSCRIPT_MINIMALIF:
            return "OP_IF/NOTIF argument must be minimal in tapscript";
        case SCRIPT_ERR_OP_CODESEPARATOR:
            return "Using OP_CODESEPARATOR in non-witness script";
        case SCRIPT_ERR_SIG_FINDANDDELETE:
            return "Signature is found in scriptCode";
        case SCRIPT_ERR_UNKNOWN_ERROR:
        case SCRIPT_ERR_ERROR_COUNT:
        default: break;
    }
    return "unknown error";
}